

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::Intersects(S2Loop *this,S2Loop *b)

{
  undefined8 this_00;
  bool bVar1;
  S2Point *pSVar2;
  bool local_8b;
  S2LatLngRect local_68;
  undefined4 local_40;
  undefined1 local_30 [8];
  IntersectsRelation relation;
  S2Loop *b_local;
  S2Loop *this_local;
  
  relation._8_8_ = b;
  bVar1 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
  if (!bVar1) {
    return false;
  }
  IntersectsRelation::IntersectsRelation((IntersectsRelation *)local_30);
  bVar1 = HasCrossingRelation(this,(S2Loop *)relation._8_8_,(LoopRelation *)local_30);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = IntersectsRelation::found_shared_vertex((IntersectsRelation *)local_30);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = S2LatLngRect::Contains
                        (&this->subregion_bound_,(S2LatLngRect *)(relation._8_8_ + 0x20));
      local_8b = true;
      if (!bVar1) {
        S2LatLngRect::Union(&local_68,&this->bound_,(S2LatLngRect *)(relation._8_8_ + 0x20));
        local_8b = S2LatLngRect::is_full(&local_68);
        S2LatLngRect::~S2LatLngRect(&local_68);
      }
      if (local_8b != false) {
        pSVar2 = vertex((S2Loop *)relation._8_8_,0);
        bVar1 = Contains(this,pSVar2);
        if (bVar1) {
          this_local._7_1_ = true;
          goto LAB_004a2f45;
        }
      }
      bVar1 = S2LatLngRect::Contains((S2LatLngRect *)(relation._8_8_ + 0x48),&this->bound_);
      this_00 = relation._8_8_;
      if (bVar1) {
        pSVar2 = vertex(this,0);
        bVar1 = Contains((S2Loop *)this_00,pSVar2);
        if (bVar1) {
          this_local._7_1_ = true;
          goto LAB_004a2f45;
        }
      }
      this_local._7_1_ = false;
    }
  }
LAB_004a2f45:
  local_40 = 1;
  IntersectsRelation::~IntersectsRelation((IntersectsRelation *)local_30);
  return this_local._7_1_;
}

Assistant:

bool S2Loop::Intersects(const S2Loop* b) const {
  // a->Intersects(b) if and only if !a->Complement()->Contains(b).
  // This code is similar to Contains(), but is optimized for the case
  // where both loops enclose less than half of the sphere.
  if (!bound_.Intersects(b->bound_)) return false;

  // Check whether there are any edge crossings, and also check the loop
  // relationship at any shared vertices.
  IntersectsRelation relation;
  if (HasCrossingRelation(*this, *b, &relation)) return true;
  if (relation.found_shared_vertex()) return false;

  // Since there are no edge intersections or shared vertices, the loops
  // intersect only if A contains B, B contains A, or the two loops contain
  // each other's boundaries.  These checks are usually cheap because of the
  // bounding box preconditions.  Note that neither loop is empty (because of
  // the bounding box check above), so it is safe to access vertex(0).

  // Check whether A contains B, or A and B contain each other's boundaries.
  // (Note that A contains all the vertices of B in either case.)
  if (subregion_bound_.Contains(b->bound_) ||
      bound_.Union(b->bound_).is_full()) {
    if (Contains(b->vertex(0))) return true;
  }
  // Check whether B contains A.
  if (b->subregion_bound_.Contains(bound_)) {
    if (b->Contains(vertex(0))) return true;
  }
  return false;
}